

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void nn_sha1_init(nn_sha1 *self)

{
  self->state[0] = 0x67452301;
  self->state[1] = 0xefcdab89;
  self->state[2] = 0x98badcfe;
  self->state[3] = 0x10325476;
  *(undefined8 *)(self->state + 4) = 0xc3d2e1f0;
  self->buffer_offset = '\0';
  self->is_little_endian = '\x01';
  return;
}

Assistant:

void nn_sha1_init (struct nn_sha1 *self)
{
    /*  Detect endianness. */
    union {
        uint32_t i;
        char c[4];
    } test = { 0x00000001 };

    self->is_little_endian = test.c[0];

    /*  Initial state of the hash. */
    self->state [0] = 0x67452301;
    self->state [1] = 0xefcdab89;
    self->state [2] = 0x98badcfe;
    self->state [3] = 0x10325476;
    self->state [4] = 0xc3d2e1f0;
    self->bytes_hashed = 0;
    self->buffer_offset = 0;
}